

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O1

void __thiscall ninx::lexer::Lexer::Lexer(Lexer *this,istream *stream,string *origin)

{
  pointer pcVar1;
  
  this->stream = stream;
  (this->origin)._M_dataplus._M_p = (pointer)&(this->origin).field_2;
  pcVar1 = (origin->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->origin,pcVar1,pcVar1 + origin->_M_string_length);
  Reader::Reader(&this->reader,stream,origin);
  this->verbose = false;
  return;
}

Assistant:

ninx::lexer::Lexer::Lexer(std::istream &stream, std::string origin) : stream{stream}, origin{origin},
                                                                      reader{Reader{stream, origin}} {
}